

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O0

int __thiscall
chaiscript::detail::Any::Data_Impl<std::reference_wrapper<std::logic_error>_>::clone
          (Data_Impl<std::reference_wrapper<std::logic_error>_> *this,__fn *__fn,void *__child_stack
          ,int __flags,void *__arg,...)

{
  reference_wrapper<std::logic_error> local_20;
  __fn *local_18;
  Data_Impl<std::reference_wrapper<std::logic_error>_> *this_local;
  
  local_18 = __fn;
  this_local = this;
  std::
  make_unique<chaiscript::detail::Any::Data_Impl<std::reference_wrapper<std::logic_error>>,std::reference_wrapper<std::logic_error>const&>
            (&local_20);
  std::unique_ptr<chaiscript::detail::Any::Data,std::default_delete<chaiscript::detail::Any::Data>>
  ::
  unique_ptr<chaiscript::detail::Any::Data_Impl<std::reference_wrapper<std::logic_error>>,std::default_delete<chaiscript::detail::Any::Data_Impl<std::reference_wrapper<std::logic_error>>>,void>
            ((unique_ptr<chaiscript::detail::Any::Data,std::default_delete<chaiscript::detail::Any::Data>>
              *)this,(unique_ptr<chaiscript::detail::Any::Data_Impl<std::reference_wrapper<std::logic_error>_>,_std::default_delete<chaiscript::detail::Any::Data_Impl<std::reference_wrapper<std::logic_error>_>_>_>
                      *)&local_20);
  std::
  unique_ptr<chaiscript::detail::Any::Data_Impl<std::reference_wrapper<std::logic_error>_>,_std::default_delete<chaiscript::detail::Any::Data_Impl<std::reference_wrapper<std::logic_error>_>_>_>
  ::~unique_ptr((unique_ptr<chaiscript::detail::Any::Data_Impl<std::reference_wrapper<std::logic_error>_>,_std::default_delete<chaiscript::detail::Any::Data_Impl<std::reference_wrapper<std::logic_error>_>_>_>
                 *)&local_20);
  return (int)this;
}

Assistant:

std::unique_ptr<Data> clone() const override { return std::make_unique<Data_Impl<T>>(m_data); }